

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O1

void __thiscall
t_lua_generator::generate_serialize_field
          (t_lua_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  int iVar1;
  t_type *ttype;
  ostream *poVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  t_struct *tstruct;
  _Alloc_hider _Var4;
  t_base_type *this_00;
  undefined1 auVar5 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  std::operator+(&local_b0,prefix,&tfield->name_);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar1 != '\0') {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar3,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",&local_b0);
    __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar1 == '\0')) {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if (((char)iVar1 == '\0') &&
         (iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype),
         _Var4._M_p = local_b0._M_dataplus._M_p, (char)iVar1 == '\0')) {
        iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s\' TYPE \'%s\'\n",_Var4._M_p,
               *(undefined8 *)CONCAT44(extraout_var,iVar1));
      }
      else {
        poVar2 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"oprot:",6);
        iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
          if ((char)iVar1 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32(",9);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
          }
        }
        else {
          this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
          switch(this_00) {
          case (t_base_type *)0x0:
            pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::operator+(pbVar3,"compiler error: cannot serialize void field in a struct: ",
                           &local_b0);
            __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          case (t_base_type *)0x1:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeString(",0xc);
            break;
          case (t_base_type *)0x2:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeBool(",10);
            break;
          case (t_base_type *)0x3:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeByte(",10);
            break;
          case (t_base_type *)0x4:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeI16(",9);
            break;
          case (t_base_type *)0x5:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32(",9);
            break;
          case (t_base_type *)0x6:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeI64(",9);
            break;
          case (t_base_type *)0x7:
            std::__ostream_insert<char,std::char_traits<char>>(out,"writeDouble(",0xc);
            break;
          default:
            auVar5 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_(&local_50,this_00,auVar5._8_4_);
            std::operator+(auVar5._0_8_,"compiler error: no PHP name for base type ",&local_50);
            __cxa_throw(auVar5._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      goto LAB_002ad1df;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    generate_serialize_container(this,out,ttype,&local_90);
    _Var4._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_002ad1df;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    generate_serialize_struct(this,out,tstruct,&local_70);
    _Var4._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_002ad1df;
  }
  operator_delete(_Var4._M_p);
LAB_002ad1df:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_lua_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());
  string name = prefix + tfield->get_name();

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name);
  } else if (type->is_base_type() || type->is_enum()) {
    indent(out) << "oprot:";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "writeString(" << name << ")";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ")";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ")";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ")";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ")";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ")";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ")";
        break;
      default:
        throw "compiler error: no PHP name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ")";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s' TYPE '%s'\n",
           name.c_str(),
           type->get_name().c_str());
  }
}